

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O0

void dmrC_get_char_constant(dmr_C *C,token *token,unsigned_long_long *val)

{
  uint uVar1;
  int local_5c;
  uint local_34;
  int type;
  uint v;
  char *end;
  char *p;
  unsigned_long_long *val_local;
  token *token_local;
  dmr_C *C_local;
  
  end = (char *)&token->field_2;
  uVar1 = *(uint *)&token->pos & 0x3f;
  if (uVar1 != 5) {
    if (uVar1 - 6 < 4) {
      _type = end + (long)(int)uVar1 + -5;
      goto LAB_0010ac4c;
    }
    if (uVar1 != 10) {
      _type = end + (long)(int)uVar1 + -10;
      goto LAB_0010ac4c;
    }
  }
  end = (char *)((long)&((token->field_2).ident)->next + 4);
  _type = end + (long)(int)((uint)*(token->field_2).string & 0x7fffffff) + -1;
LAB_0010ac4c:
  if (uVar1 < 10) {
    local_5c = C->target->bits_in_char;
  }
  else {
    local_5c = C->target->bits_in_wchar;
  }
  p = (char *)val;
  val_local = (unsigned_long_long *)token;
  token_local = (token *)C;
  end = parse_escape(C,end,&local_34,_type,local_5c,token->pos);
  if (end != _type) {
    dmrC_warning((dmr_C *)token_local,(position)*val_local,"multi-character character constant");
  }
  *(ulong *)p = (ulong)local_34;
  return;
}

Assistant:

void dmrC_get_char_constant(struct dmr_C *C, struct token *token, unsigned long long *val)
{
	const char *p = token->embedded, *end;
	unsigned v;
	int type = dmrC_token_type(token);
	switch (type) {
	case TOKEN_CHAR:
	case TOKEN_WIDE_CHAR:
		p = token->string->data;
		end = p + token->string->length - 1;
		break;
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
		end = p + type - TOKEN_CHAR;
		break;
	default:
		end = p + type - TOKEN_WIDE_CHAR;
	}
	p = parse_escape(C, p, &v, end,
			type < TOKEN_WIDE_CHAR ? C->target->bits_in_char : C->target->bits_in_wchar, token->pos);
	if (p != end)
		dmrC_warning(C, token->pos,
			"multi-character character constant");
	*val = v;
}